

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingComponentsTest *this,GLchar *name,GLint location,
          GLint component,STAGES stage,STORAGE storage)

{
  GLchar *text;
  GLchar *prefix;
  size_t position;
  allocator<char> local_4a;
  undefined1 local_49;
  char local_48 [8];
  GLchar buffer [16];
  STAGES stage_local;
  GLint component_local;
  GLint location_local;
  GLchar *name_local;
  VaryingComponentsTest *this_local;
  string *result;
  
  local_49 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"PREFIXNAME_lLOCATION_cCOMPONENT",&local_4a);
  std::allocator<char>::~allocator(&local_4a);
  prefix = (GLchar *)0x0;
  text = Utils::ProgramInterface::GetStagePrefix(stage,storage);
  Utils::replaceToken("PREFIX",(size_t *)&prefix,text,__return_storage_ptr__);
  Utils::replaceToken("NAME",(size_t *)&prefix,name,__return_storage_ptr__);
  sprintf(local_48,"%d",(ulong)(uint)location);
  Utils::replaceToken("LOCATION",(size_t *)&prefix,local_48,__return_storage_ptr__);
  sprintf(local_48,"%d",(ulong)(uint)component);
  Utils::replaceToken("COMPONENT",(size_t *)&prefix,local_48,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingComponentsTest::prepareName(const glw::GLchar* name, glw::GLint location, glw::GLint component,
											   Utils::Shader::STAGES stage, Utils::Variable::STORAGE storage)
{
	GLchar		  buffer[16];
	std::string   result   = "PREFIXNAME_lLOCATION_cCOMPONENT";
	size_t		  position = 0;
	const GLchar* prefix   = Utils::ProgramInterface::GetStagePrefix(stage, storage);

	Utils::replaceToken("PREFIX", position, prefix, result);
	Utils::replaceToken("NAME", position, name, result);

	sprintf(buffer, "%d", location);
	Utils::replaceToken("LOCATION", position, buffer, result);

	sprintf(buffer, "%d", component);
	Utils::replaceToken("COMPONENT", position, buffer, result);

	return result;
}